

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void __thiscall
Assimp::glTF2Importer::InternReadFile
          (glTF2Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer puVar1;
  pointer piVar2;
  bool isBinary;
  Asset asset;
  string sStack_a48;
  Asset local_a28;
  
  puVar1 = (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  piVar2 = (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  this->mScene = pScene;
  glTF2::Asset::Asset(&local_a28,pIOHandler);
  BaseImporter::GetExtension(&sStack_a48,pFile);
  isBinary = std::operator==(&sStack_a48,"glb");
  glTF2::Asset::Load(&local_a28,pFile,isBinary);
  std::__cxx11::string::~string((string *)&sStack_a48);
  ImportEmbeddedTextures(this,&local_a28);
  ImportMaterials(this,&local_a28);
  ImportMeshes(this,&local_a28);
  ImportCameras(this,&local_a28);
  ImportLights(this,&local_a28);
  ImportNodes(this,&local_a28);
  ImportAnimations(this,&local_a28);
  ImportCommonMetadata(this,&local_a28);
  if (pScene->mNumMeshes == 0) {
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
  }
  glTF2::Asset::~Asset(&local_a28);
  return;
}

Assistant:

void glTF2Importer::InternReadFile(const std::string &pFile, aiScene *pScene, IOSystem *pIOHandler) {
	// clean all member arrays
	meshOffsets.clear();
	embeddedTexIdxs.clear();

	this->mScene = pScene;

	// read the asset file
	glTF2::Asset asset(pIOHandler);
	asset.Load(pFile, GetExtension(pFile) == "glb");

	//
	// Copy the data out
	//

	ImportEmbeddedTextures(asset);
	ImportMaterials(asset);

	ImportMeshes(asset);

	ImportCameras(asset);
	ImportLights(asset);

	ImportNodes(asset);

	ImportAnimations(asset);

    ImportCommonMetadata(asset);

	if (pScene->mNumMeshes == 0) {
		pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
	}
}